

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclientconnector.hpp
# Opt level: O2

void __thiscall
TestClientConnector::VerifyNotificationRequest
          (TestClientConnector *this,version version,string *name)

{
  code *pcVar1;
  char extraout_AL;
  char extraout_AL_00;
  bool bVar2;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  reference pvVar3;
  double __x;
  double __x_00;
  double dVar4;
  double __x_01;
  allocator<char> local_105;
  ExpressionDecomposer local_104;
  Result local_100;
  ulong local_e0;
  string local_d8;
  ResultBuilder DOCTEST_RB;
  
  doctest::String::String((String *)&local_100,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
             ,0x3b,"request[\"method\"] == name","",(String *)&local_100);
  doctest::String::~String((String *)&local_100);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&local_e0,DT_CHECK);
  local_d8._M_dataplus._M_p =
       (pointer)nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)&this->request,"method");
  local_d8._M_string_length._0_4_ = local_e0._0_4_;
  doctest::detail::
  Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
  ::operator==(&local_100,
               (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                *)&local_d8,name);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_100);
  doctest::String::~String(&local_100.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  if (version == v2) {
    doctest::String::String((String *)&local_100,"");
    doctest::detail::ResultBuilder::ResultBuilder
              (&DOCTEST_RB,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x3d,"request[\"jsonrpc\"] == \"2.0\"","",(String *)&local_100);
    doctest::String::~String((String *)&local_100);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer
              ((ExpressionDecomposer *)&local_e0,DT_CHECK);
    local_d8._M_dataplus._M_p =
         (pointer)nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)&this->request,"jsonrpc");
    local_d8._M_string_length._0_4_ = local_e0._0_4_;
    doctest::detail::
    Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
    ::operator==(&local_100,
                 (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                  *)&local_d8,(char (*) [4])"2.0");
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_100);
    doctest::String::~String(&local_100.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_00);
    if (extraout_AL_00 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    doctest::String::String((String *)&local_100,"");
    doctest::detail::ResultBuilder::ResultBuilder
              (&DOCTEST_RB,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x3e,"!has_key(request, \"id\")","",(String *)&local_100);
    doctest::String::~String((String *)&local_100);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_104,DT_CHECK);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"id",&local_105);
    bVar2 = jsonrpccxx::has_key(&this->request,&local_d8);
    local_e0 = (ulong)!bVar2 | (ulong)local_104.m_at << 0x20;
    doctest::detail::Expression_lhs::operator_cast_to_Result(&local_100,(Expression_lhs *)&local_e0)
    ;
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_100);
    doctest::String::~String(&local_100.m_decomp);
    dVar4 = (double)std::__cxx11::string::~string((string *)&local_d8);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,dVar4);
    if (extraout_AL_01 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  }
  else {
    doctest::String::String((String *)&local_100,"");
    doctest::detail::ResultBuilder::ResultBuilder
              (&DOCTEST_RB,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x40,"!has_key(request, \"jsonrpc\")","",(String *)&local_100);
    doctest::String::~String((String *)&local_100);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_104,DT_CHECK);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"jsonrpc",&local_105);
    bVar2 = jsonrpccxx::has_key(&this->request,&local_d8);
    local_e0 = (ulong)!bVar2 | (ulong)local_104.m_at << 0x20;
    doctest::detail::Expression_lhs::operator_cast_to_Result(&local_100,(Expression_lhs *)&local_e0)
    ;
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_100);
    doctest::String::~String(&local_100.m_decomp);
    dVar4 = (double)std::__cxx11::string::~string((string *)&local_d8);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,dVar4);
    if (extraout_AL_02 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    doctest::String::String((String *)&local_100,"");
    doctest::detail::ResultBuilder::ResultBuilder
              (&DOCTEST_RB,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x41,"request[\"id\"].is_null()","",(String *)&local_100);
    doctest::String::~String((String *)&local_100);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer
              ((ExpressionDecomposer *)&local_e0,DT_CHECK);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&this->request,"id");
    local_d8._M_dataplus._M_p = (pointer)((ulong)(pvVar3->m_type == null) | local_e0 << 0x20);
    doctest::detail::Expression_lhs::operator_cast_to_Result(&local_100,(Expression_lhs *)&local_d8)
    ;
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_100);
    doctest::String::~String(&local_100.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_01);
    if (extraout_AL_03 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    doctest::String::String((String *)&local_100,"");
    doctest::detail::ResultBuilder::ResultBuilder
              (&DOCTEST_RB,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x42,"has_key(request, \"params\")","",(String *)&local_100);
    doctest::String::~String((String *)&local_100);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_104,DT_CHECK);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"params",&local_105);
    bVar2 = jsonrpccxx::has_key(&this->request,&local_d8);
    local_e0 = (ulong)bVar2 | (ulong)local_104.m_at << 0x20;
    doctest::detail::Expression_lhs::operator_cast_to_Result(&local_100,(Expression_lhs *)&local_e0)
    ;
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_100);
    doctest::String::~String(&local_100.m_decomp);
    dVar4 = (double)std::__cxx11::string::~string((string *)&local_d8);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,dVar4);
    if (extraout_AL_04 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  }
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  return;
}

Assistant:

void VerifyNotificationRequest(version version, const string &name) {
    CHECK(request["method"] == name);
    if (version == version::v2) {
      CHECK(request["jsonrpc"] == "2.0");
      CHECK(!has_key(request, "id"));
    } else {
      CHECK(!has_key(request, "jsonrpc"));
      CHECK(request["id"].is_null());
      CHECK(has_key(request, "params"));
    }
  }